

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

bool __thiscall DynamicHistogram<double>::contains(DynamicHistogram<double> *this,double value)

{
  int iVar1;
  int iVar2;
  runtime_error *this_00;
  double dVar3;
  
  iVar1 = (*this->_vptr_DynamicHistogram[2])();
  if ((char)iVar1 != '\0') {
    if ((this->_binMax != value) || (NAN(this->_binMax) || NAN(value))) {
      dVar3 = floor((value - this->_binMin) / this->_binWidth);
      iVar1 = (int)dVar3;
      iVar2 = this->_binCount;
    }
    else {
      iVar2 = this->_binCount;
      iVar1 = iVar2 + -1;
    }
    return iVar1 < iVar2 && -1 < iVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"DynamicHistogram::contains - Histogram could not be initialized.");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool
    contains(double const value)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::contains - Histogram could not be initialized.");
        return this->contains_(value);
    }